

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

bool __thiscall cmCPackIFWRepository::IsValid(cmCPackIFWRepository *this)

{
  byte bVar1;
  uint uVar2;
  byte local_29;
  bool local_11;
  bool valid;
  cmCPackIFWRepository *this_local;
  
  local_11 = true;
  switch(this->Update) {
  case None:
    bVar1 = std::__cxx11::string::empty();
    local_11 = (bool)((bVar1 ^ 0xff) & 1);
    break;
  case Add:
    bVar1 = std::__cxx11::string::empty();
    local_11 = (bool)((bVar1 ^ 0xff) & 1);
    break;
  case Remove:
    bVar1 = std::__cxx11::string::empty();
    local_11 = (bool)((bVar1 ^ 0xff) & 1);
    break;
  case Replace:
    uVar2 = std::__cxx11::string::empty();
    local_29 = 0;
    if ((uVar2 & 1) == 0) {
      local_29 = std::__cxx11::string::empty();
      local_29 = local_29 ^ 0xff;
    }
    local_11 = (bool)(local_29 & 1);
  }
  return local_11;
}

Assistant:

bool cmCPackIFWRepository::IsValid() const
{
  bool valid = true;

  switch (this->Update) {
    case cmCPackIFWRepository::None:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Add:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Remove:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Replace:
      valid = !this->OldUrl.empty() && !this->NewUrl.empty();
      break;
  }

  return valid;
}